

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlPass::DebugEngineCode(GdlPass *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  ostream *poVar1;
  uint32_t uVar2;
  GrcManager *pGVar3;
  int iVar4;
  size_t iprul;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbPassConstraints;
  
  iVar4 = this->m_nGlobalID + this->m_nPreBidiPass + 1;
  poVar1 = std::operator<<(strmOut,"\nPASS: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
  pGVar3 = (GrcManager *)0x1cc258;
  std::operator<<(poVar1,"\n");
  vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenerateEngineCode(this,pGVar3,fxdRuleVersion,&vbPassConstraints);
  if (vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<(strmOut,"\nPASS CONSTRAINTS: none\n");
  }
  else {
    uVar2 = 0x1c8522;
    std::operator<<(strmOut,"\nPASS CONSTRAINTS:\n");
    GdlRule::DebugEngineCode(&vbPassConstraints,uVar2,strmOut);
  }
  if ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<(strmOut,"\nNO RULES\n");
  }
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->m_vprule).
                            super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_vprule).
                            super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    poVar1 = std::operator<<(strmOut,"\nRULE ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
    poVar1 = std::operator<<(poVar1,".");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,", ");
    GrpLineAndFile::WriteToStream
              ((GrpLineAndFile *)
               (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5],strmOut,true);
    std::operator<<(strmOut,":  ");
    GdlRule::RulePrettyPrint
              ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5],pcman,strmOut,false);
    std::operator<<(strmOut,"\n");
    GdlRule::DebugEngineCode
              ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5],pcman,fxdRuleVersion,strmOut);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vbPassConstraints.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void GdlPass::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	int nPassNum = PassDebuggerNumber();
	strmOut << "\nPASS: " << nPassNum << "\n";

	std::vector<gr::byte> vbPassConstraints;
	GenerateEngineCode(pcman, fxdRuleVersion, vbPassConstraints);
	if (vbPassConstraints.size() == 0)
	{
		strmOut << "\nPASS CONSTRAINTS: none\n";
	}
	else
	{
		strmOut << "\nPASS CONSTRAINTS:\n";
		GdlRule::DebugEngineCode(vbPassConstraints, fxdRuleVersion, strmOut);
	}

	if (m_vprule.size() == 0)
		strmOut << "\nNO RULES\n";

	for (size_t iprul = 0; iprul < m_vprule.size(); iprul++)
	{
		strmOut << "\nRULE " << nPassNum << "." << iprul << ", ";
		m_vprule[iprul]->LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		m_vprule[iprul]->RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n";
		m_vprule[iprul]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}